

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O2

void rgbcx::bc1_find_sels4_noerr
               (color32 *pSrc_pixels,uint32_t lr,uint32_t lg,uint32_t lb,uint32_t hr,uint32_t hg,
               uint32_t hb,uint8_t *sels)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int dots [4];
  uint32_t block_b [4];
  uint32_t block_g [4];
  uint32_t block_r [4];
  
  bc1_get_block_colors4(block_r,block_g,block_b,lr,lg,lb,hr,hg,hb);
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    dots[lVar6] = block_b[lVar6] * (block_b[3] - block_b[0]) +
                  block_g[lVar6] * (block_g[3] - block_g[0]) +
                  block_r[lVar6] * (block_r[3] - block_r[0]);
  }
  iVar8 = dots[0] + dots[1];
  iVar5 = dots[1] + dots[2];
  iVar7 = dots[2] + dots[3];
  iVar1 = (block_r[3] - block_r[0]) * 2;
  iVar2 = (block_g[3] - block_g[0]) * 2;
  iVar3 = (block_b[3] - block_b[0]) * 2;
  for (uVar9 = 0; uVar9 < 0x10; uVar9 = uVar9 + 4) {
    iVar11 = (uint)pSrc_pixels[uVar9].field_0.field_0.b * iVar3 +
             (uint)pSrc_pixels[uVar9].field_0.field_0.g * iVar2 +
             (uint)pSrc_pixels[uVar9].field_0.field_0.r * iVar1;
    iVar12 = (uint)pSrc_pixels[uVar9 + 1].field_0.field_0.b * iVar3 +
             (uint)pSrc_pixels[uVar9 + 1].field_0.field_0.g * iVar2 +
             (uint)pSrc_pixels[uVar9 + 1].field_0.field_0.r * iVar1;
    iVar4 = (uint)pSrc_pixels[uVar9 + 2].field_0.field_0.b * iVar3 +
            (uint)pSrc_pixels[uVar9 + 2].field_0.field_0.g * iVar2 +
            (uint)pSrc_pixels[uVar9 + 2].field_0.field_0.r * iVar1;
    iVar10 = (uint)pSrc_pixels[uVar9 + 3].field_0.field_0.b * iVar3 +
             (uint)pSrc_pixels[uVar9 + 3].field_0.field_0.g * iVar2 +
             (uint)pSrc_pixels[uVar9 + 3].field_0.field_0.r * iVar1;
    sels[uVar9] = "\x03\x02\x01"
                  [(ulong)(iVar11 < iVar7) + (ulong)(iVar11 < iVar5) + (ulong)(iVar11 <= iVar8)];
    sels[uVar9 + 1] =
         "\x03\x02\x01"
         [(ulong)(iVar12 < iVar7) + (ulong)(iVar12 < iVar5) + (ulong)(iVar12 <= iVar8)];
    sels[uVar9 + 2] =
         "\x03\x02\x01"[(ulong)(iVar4 < iVar7) + (ulong)(iVar4 < iVar5) + (ulong)(iVar4 <= iVar8)];
    sels[uVar9 + 3] =
         "\x03\x02\x01"
         [(ulong)(iVar10 < iVar7) + (ulong)(iVar10 < iVar5) + (ulong)(iVar10 <= iVar8)];
  }
  return;
}

Assistant:

static inline void bc1_find_sels4_noerr(const color32* pSrc_pixels, uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb, uint8_t sels[16])
	{
		uint32_t block_r[4], block_g[4], block_b[4];
		bc1_get_block_colors4(block_r, block_g, block_b, lr, lg, lb, hr, hg, hb);

		int ar = block_r[3] - block_r[0], ag = block_g[3] - block_g[0], ab = block_b[3] - block_b[0];

		int dots[4];
		for (uint32_t i = 0; i < 4; i++)
			dots[i] = (int)block_r[i] * ar + (int)block_g[i] * ag + (int)block_b[i] * ab;

		int t0 = dots[0] + dots[1], t1 = dots[1] + dots[2], t2 = dots[2] + dots[3];

		ar *= 2; ag *= 2; ab *= 2;

		static const uint8_t s_sels[4] = { 3, 2, 1, 0 };

		for (uint32_t i = 0; i < 16; i += 4)
		{
			const int d0 = pSrc_pixels[i+0].r * ar + pSrc_pixels[i+0].g * ag + pSrc_pixels[i+0].b * ab;
			const int d1 = pSrc_pixels[i+1].r * ar + pSrc_pixels[i+1].g * ag + pSrc_pixels[i+1].b * ab;
			const int d2 = pSrc_pixels[i+2].r * ar + pSrc_pixels[i+2].g * ag + pSrc_pixels[i+2].b * ab;
			const int d3 = pSrc_pixels[i+3].r * ar + pSrc_pixels[i+3].g * ag + pSrc_pixels[i+3].b * ab;

			sels[i+0] = s_sels[(d0 <= t0) + (d0 < t1) + (d0 < t2)];
			sels[i+1] = s_sels[(d1 <= t0) + (d1 < t1) + (d1 < t2)];
			sels[i+2] = s_sels[(d2 <= t0) + (d2 < t1) + (d2 < t2)];
			sels[i+3] = s_sels[(d3 <= t0) + (d3 < t1) + (d3 < t2)];
		}
	}